

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O2

AlexNode<int,_int> * __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::NodeIterator::
next(NodeIterator *this)

{
  stack<alex::AlexNode<int,_int>_*,_std::deque<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>_>
  *this_00;
  int iVar1;
  double dVar2;
  _Elt_pointer ppAVar3;
  ulong uVar4;
  uint uVar5;
  model_node_type *node;
  AlexNode<int,_int> *pAVar6;
  
  ppAVar3 = (this->node_stack_).c.
            super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppAVar3 ==
      (this->node_stack_).c.
      super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur) {
    this->cur_node_ = (AlexNode<int,_int> *)0x0;
    pAVar6 = (AlexNode<int,_int> *)0x0;
  }
  else {
    this_00 = &this->node_stack_;
    if (ppAVar3 ==
        (this->node_stack_).c.
        super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_first) {
      ppAVar3 = (this->node_stack_).c.
                super__Deque_base<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    this->cur_node_ = ppAVar3[-1];
    std::deque<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>::pop_back
              (&this_00->c);
    pAVar6 = this->cur_node_;
    if (pAVar6->is_leaf_ == false) {
      iVar1._0_1_ = pAVar6[1].is_leaf_;
      iVar1._1_1_ = pAVar6[1].duplication_factor_;
      iVar1._2_2_ = pAVar6[1].level_;
      std::deque<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>::push_back
                (&this_00->c,(value_type *)((long)pAVar6[1].model_.a_ + -8 + (long)iVar1 * 8));
      for (uVar5 = *(int *)&pAVar6[1].is_leaf_ - 2; -1 < (int)uVar5; uVar5 = uVar5 - 1) {
        dVar2 = pAVar6[1].model_.a_;
        uVar4 = (ulong)uVar5;
        if (*(long *)((long)dVar2 + uVar4 * 8) != *(long *)((long)dVar2 + 8 + uVar4 * 8)) {
          std::deque<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>::
          push_back(&this_00->c,(value_type *)((long)dVar2 + uVar4 * 8));
        }
      }
      pAVar6 = this->cur_node_;
    }
  }
  return pAVar6;
}

Assistant:

AlexNode<T, P>* next() {
      if (node_stack_.empty()) {
        cur_node_ = nullptr;
        return nullptr;
      }

      cur_node_ = node_stack_.top();
      node_stack_.pop();

      if (!cur_node_->is_leaf_) {
        auto node = static_cast<model_node_type*>(cur_node_);
        node_stack_.push(node->children_[node->num_children_ - 1]);
        for (int i = node->num_children_ - 2; i >= 0; i--) {
          if (node->children_[i] != node->children_[i + 1]) {
            node_stack_.push(node->children_[i]);
          }
        }
      }

      return cur_node_;
    }